

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMD.cpp
# Opt level: O0

void __thiscall Storage::Disk::IMD::IMD(IMD *this,string *file_name)

{
  bool bVar1;
  uint8_t uVar2;
  uint uVar3;
  undefined4 *puVar4;
  uchar *puVar5;
  int local_5c;
  uint8_t type;
  int c;
  HeadPosition local_44;
  Address local_40;
  byte local_35;
  byte local_34;
  byte local_33;
  byte local_32;
  byte local_31;
  uint8_t sector_size;
  uint8_t sector_count;
  uint8_t head;
  long lStack_30;
  uint8_t cylinder;
  long location;
  string *local_18;
  string *file_name_local;
  IMD *this_local;
  
  local_18 = file_name;
  file_name_local = (string *)this;
  DiskImage::DiskImage(&this->super_DiskImage);
  (this->super_DiskImage)._vptr_DiskImage = (_func_int **)&PTR__IMD_00caa378;
  FileHolder::FileHolder(&this->file_,local_18,ReadWrite);
  std::
  map<Storage::Disk::Track::Address,_long,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_long>_>_>
  ::map(&this->track_locations_);
  this->cylinders_ = '\0';
  this->heads_ = '\0';
  bVar1 = FileHolder::check_signature(&this->file_,"IMD",0);
  if (!bVar1) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0xfffffffe;
    __cxa_throw(puVar4,&Error::typeinfo,0);
  }
  do {
    uVar2 = FileHolder::get8(&this->file_);
  } while (uVar2 != '\x1a');
  do {
    lStack_30 = FileHolder::tell(&this->file_);
    FileHolder::seek(&this->file_,1,1);
    local_31 = FileHolder::get8(&this->file_);
    local_32 = FileHolder::get8(&this->file_);
    local_33 = FileHolder::get8(&this->file_);
    local_34 = FileHolder::get8(&this->file_);
    bVar1 = FileHolder::eof(&this->file_);
    if (bVar1) {
      this->cylinders_ = this->cylinders_ + '\x01';
      this->heads_ = this->heads_ + '\x01';
      return;
    }
    puVar5 = std::max<unsigned_char>(&local_31,&this->cylinders_);
    this->cylinders_ = *puVar5;
    local_35 = local_32 & 1;
    puVar5 = std::max<unsigned_char>(&local_35,&this->heads_);
    this->heads_ = *puVar5;
    uVar3 = (uint)local_32;
    HeadPosition::HeadPosition(&local_44,(uint)local_31);
    Track::Address::Address(&local_40,uVar3 & 1,local_44);
    std::
    map<Storage::Disk::Track::Address,long,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,long>>>
    ::emplace<Storage::Disk::Track::Address,long_const&>
              ((map<Storage::Disk::Track::Address,long,std::less<Storage::Disk::Track::Address>,std::allocator<std::pair<Storage::Disk::Track::Address_const,long>>>
                *)&this->track_locations_,&local_40,&stack0xffffffffffffffd0);
    FileHolder::seek(&this->file_,(ulong)local_33,1);
    if ((local_32 & 0x80) != 0) {
      FileHolder::seek(&this->file_,(ulong)local_33,1);
    }
    if ((local_32 & 0x40) != 0) {
      FileHolder::seek(&this->file_,(ulong)local_33,1);
    }
    for (local_5c = 0; local_5c < (int)(uint)local_33; local_5c = local_5c + 1) {
      uVar2 = FileHolder::get8(&this->file_);
      if (uVar2 != '\0') {
        if (uVar2 == '\x01') {
LAB_0096b156:
          FileHolder::seek(&this->file_,(long)(0x80 << (local_34 & 0x1f)),1);
        }
        else {
          if (uVar2 != '\x02') {
            if (uVar2 == '\x03') goto LAB_0096b156;
            if (uVar2 != '\x04') {
              if (uVar2 == '\x05') goto LAB_0096b156;
              if (uVar2 != '\x06') {
                if (uVar2 == '\a') goto LAB_0096b156;
                if (uVar2 != '\b') goto LAB_0096b194;
              }
            }
          }
          FileHolder::seek(&this->file_,1,1);
        }
      }
LAB_0096b194:
    }
  } while( true );
}

Assistant:

IMD::IMD(const std::string &file_name) : file_(file_name) {
	// Check for signature.
	if(!file_.check_signature("IMD")) {
		throw Error::InvalidFormat;
	}

	// Skip rest of ASCII.
	while(file_.get8() != 0x1a);

	// Build track map.
	while(true) {
		const auto location = file_.tell();

		// Skip mode.
		file_.seek(1, SEEK_CUR);

		// Grab relevant fields.
		const uint8_t cylinder = file_.get8();
		const uint8_t head = file_.get8();
		const uint8_t sector_count = file_.get8();
		const uint8_t sector_size = file_.get8();
		if(file_.eof()) {
			break;
		}

		cylinders_ = std::max(cylinder, cylinders_);
		heads_ = std::max(uint8_t(head & 1), heads_);

		// Update head and cylinder extents, record sector location for later.
		track_locations_.emplace(
			Storage::Disk::Track::Address(head & 1, HeadPosition(cylinder)),
			location);

		// Skip sector numbers.
		file_.seek(sector_count, SEEK_CUR);

		// Skip cylinder map.
		if(head & 0x80) {
			file_.seek(sector_count, SEEK_CUR);
		}

		// Skip head map.
		if(head & 0x40) {
			file_.seek(sector_count, SEEK_CUR);
		}

		// Skip sectors.
		for(int c = 0; c < sector_count; c++) {
			const uint8_t type = file_.get8();
			switch(type) {
				case 0x00:	break;	// Sector couldn't be read.

				// Types with all sector data present.
				case 0x01:	case 0x03:	case 0x05:	case 0x07:
					file_.seek(128 << sector_size, SEEK_CUR);
				break;

				// Types with a single byte present.
				case 0x02:	case 0x04:	case 0x06:	case 0x08:
					file_.seek(1, SEEK_CUR);
				break;
			}
		}
	}

	// Both heads_ and cylinders_ are now the maximum observed IDs, which
	// are one less than the counts.
	++ cylinders_;
	++ heads_;
}